

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  char cVar1;
  char cVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  string local_40;
  
  switch(other) {
  case nullValue:
    bVar5 = isNumeric(this);
    if (bVar5) {
      dVar6 = asDouble(this);
      bVar4 = 1;
      if ((dVar6 == 0.0) && (!NAN(dVar6))) goto LAB_00114637;
    }
    cVar2 = this->field_0x8;
    if ((cVar2 == '\x05') && (bVar4 = 1, (this->value_).bool_ == false)) goto LAB_00114637;
    cVar1 = cVar2;
    if (cVar2 == '\x04') {
      asString_abi_cxx11_(&local_40,this);
      iVar3 = std::__cxx11::string::compare((char *)&local_40);
      if (iVar3 != 0) {
        cVar1 = this->field_0x8;
        goto LAB_0011458f;
      }
      bVar4 = true;
    }
    else {
LAB_0011458f:
      if (((cVar1 == '\a') || (cVar1 == '\x06')) &&
         ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
        bVar4 = true;
      }
      else {
        bVar4 = cVar1 == '\0';
      }
      if (cVar2 != '\x04') goto LAB_00114637;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    goto LAB_00114637;
  case intValue:
    bVar5 = isInt(this);
    bVar4 = 1;
    if (bVar5) goto LAB_00114637;
    cVar2 = this->field_0x8;
    if ((cVar2 == '\x03') && (dVar6 = (this->value_).real_, -2147483648.0 <= dVar6)) {
      dVar7 = 2147483647.0;
LAB_001145ed:
      bVar4 = 1;
      if (dVar6 <= dVar7) goto LAB_00114637;
    }
    break;
  case uintValue:
    bVar5 = isUInt(this);
    bVar4 = 1;
    if (bVar5) goto LAB_00114637;
    cVar2 = this->field_0x8;
    if ((cVar2 == '\x03') && (dVar6 = (this->value_).real_, 0.0 <= dVar6)) {
      dVar7 = 4294967295.0;
      goto LAB_001145ed;
    }
    break;
  case realValue:
  case booleanValue:
    bVar5 = isNumeric(this);
    bVar4 = 1;
    if (bVar5) goto LAB_00114637;
    cVar2 = this->field_0x8;
    break;
  case stringValue:
    bVar5 = isNumeric(this);
    bVar4 = 1;
    if (!bVar5) {
      bVar4 = (byte)*(undefined2 *)&this->field_0x8;
      if (bVar4 < 6) {
        bVar4 = 0x31 >> (bVar4 & 0x1f);
      }
      else {
        bVar4 = 0;
      }
    }
    goto LAB_00114637;
  case arrayValue:
    cVar2 = this->field_0x8;
    bVar5 = cVar2 == '\x06';
    goto LAB_0011462a;
  case objectValue:
    cVar2 = this->field_0x8;
    bVar5 = cVar2 == '\a';
    goto LAB_0011462a;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Expost[P]SimpleFtpServer/jsoncpp.cpp"
                  ,0xcf1,"bool Json::Value::isConvertibleTo(ValueType) const");
  }
  bVar5 = cVar2 == '\x05';
LAB_0011462a:
  bVar4 = cVar2 == '\0' | bVar5;
LAB_00114637:
  return (bool)(bVar4 & 1);
}

Assistant:

bool Value::isConvertibleTo(ValueType other) const {
  switch (other) {
  case nullValue:
    return (isNumeric() && asDouble() == 0.0) ||
           (type_ == booleanValue && value_.bool_ == false) ||
           (type_ == stringValue && asString() == "") ||
           (type_ == arrayValue && value_.map_->size() == 0) ||
           (type_ == objectValue && value_.map_->size() == 0) ||
           type_ == nullValue;
  case intValue:
    return isInt() ||
           (type_ == realValue && InRange(value_.real_, minInt, maxInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case uintValue:
    return isUInt() ||
           (type_ == realValue && InRange(value_.real_, 0, maxUInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case realValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case booleanValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case stringValue:
    return isNumeric() || type_ == booleanValue || type_ == stringValue ||
           type_ == nullValue;
  case arrayValue:
    return type_ == arrayValue || type_ == nullValue;
  case objectValue:
    return type_ == objectValue || type_ == nullValue;
  }
  JSON_ASSERT_UNREACHABLE;
  return false;
}